

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * format::strip_name(string *__return_storage_ptr__,string *name)

{
  size_type p2;
  size_type p1;
  string *name_local;
  string *slide;
  
  std::__cxx11::string::rfind((char *)name,0x1eb654);
  std::__cxx11::string::rfind((char *)name,0x1ec14a);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
  return __return_storage_ptr__;
}

Assistant:

std::string strip_name(std::string name){
  auto p1 = name.rfind("/");
  auto p2 = name.rfind(".");
  std::string slide = name.substr( p1 != std::string::npos ? p1+1 : 0,
                                   p2 != std::string::npos ? p2-p1-1 : std::string::npos);
  return slide;
 }